

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  ImVector<unsigned_short> *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  ImDrawListSplitter *pIVar10;
  ImGuiTableColumn *pIVar11;
  ImDrawCmd *pIVar12;
  ImDrawChannel *pIVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  unsigned_short *puVar16;
  int iVar17;
  ImGuiContext *pIVar18;
  int iVar19;
  ImDrawChannel *pIVar20;
  int n;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  float *pfVar28;
  uint uVar29;
  ImDrawChannel *pIVar30;
  int iVar31;
  bool bVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  ImBitArray<132,_0> remaining_mask;
  MergeGroup merge_groups [4];
  ImBitArray<132,_0> local_f8;
  float local_d8 [2];
  undefined8 local_d0;
  int iStack_c8;
  uint local_c4 [37];
  
  pIVar18 = GImGui;
  pIVar10 = table->DrawSplitter;
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  uVar29 = 0;
  memset(local_d8,0,0xa0);
  iVar19 = table->ColumnsCount;
  if (0 < (long)iVar19) {
    uVar24 = table->VisibleMaskByIndex;
    uVar25 = 0;
    do {
      if ((uVar24 >> (uVar25 & 0x3f) & 1) != 0) {
        pIVar11 = (table->Columns).Data;
        pIVar30 = (pIVar10->_Channels).Data;
        iVar27 = 0;
        do {
          bVar9 = *(byte *)((long)pIVar11 + (0x59 - (ulong)(iVar27 == 0)) + uVar25 * 0x68);
          pIVar20 = pIVar30 + bVar9;
          iVar31 = pIVar30[bVar9]._CmdBuffer.Size;
          lVar22 = (long)iVar31;
          if (0 < lVar22) {
            pIVar12 = (pIVar20->_CmdBuffer).Data;
            if ((pIVar12[lVar22 + -1].ElemCount == 0) &&
               (pIVar12[lVar22 + -1].UserCallback != (ImDrawCallback)0x0)) {
              (pIVar20->_CmdBuffer).Size = iVar31 + -1;
            }
          }
          if ((pIVar20->_CmdBuffer).Size == 1) {
            if ((pIVar11[uVar25].Flags & 0x100) == 0) {
              if (cVar7 < '\x01') {
                fVar34 = pIVar11[uVar25].ContentMaxXUnfrozen;
LAB_00154a8e:
                uVar33 = -(uint)(pIVar11[uVar25].ContentMaxXHeadersUsed <= fVar34);
                fVar34 = (float)(~uVar33 & (uint)pIVar11[uVar25].ContentMaxXHeadersUsed |
                                (uint)fVar34 & uVar33);
              }
              else {
                if (iVar27 == 0) {
                  fVar34 = pIVar11[uVar25].ContentMaxXFrozen;
                  goto LAB_00154a8e;
                }
                fVar34 = pIVar11[uVar25].ContentMaxXUnfrozen;
              }
              pIVar1 = &pIVar11[uVar25].ClipRect.Max;
              if (pIVar1->x <= fVar34 && fVar34 != pIVar1->x) goto LAB_00154b48;
            }
            uVar33 = (uint)(iVar27 != 0) * 2;
            if (cVar7 < '\x01') {
              uVar33 = 2;
            }
            uVar26 = (uint)((long)cVar8 <= (long)uVar25 || cVar8 < '\x01');
            uVar23 = (ulong)(uVar33 | uVar26);
            pfVar28 = local_d8 + uVar23 * 10;
            iVar31 = local_c4[uVar23 * 10 + -1];
            if (iVar31 == 0) {
              pfVar28[0] = 3.4028235e+38;
              pfVar28[1] = 3.4028235e+38;
              (&local_d0)[uVar23 * 5] = 0xff7fffffff7fffff;
            }
            local_c4[uVar23 * 10 + (ulong)(bVar9 >> 5)] =
                 local_c4[uVar23 * 10 + (ulong)(bVar9 >> 5)] | 1 << (bVar9 & 0x1f);
            local_c4[uVar23 * 10 + -1] = iVar31 + 1;
            pIVar12 = (pIVar20->_CmdBuffer).Data;
            fVar34 = (pIVar12->ClipRect).x;
            if (fVar34 < *pfVar28) {
              *pfVar28 = fVar34;
            }
            fVar34 = (pIVar12->ClipRect).y;
            if (fVar34 < local_d8[uVar23 * 10 + 1]) {
              local_d8[uVar23 * 10 + 1] = fVar34;
            }
            fVar34 = (pIVar12->ClipRect).z;
            if (*(float *)(&local_d0 + uVar23 * 5) <= fVar34 &&
                fVar34 != *(float *)(&local_d0 + uVar23 * 5)) {
              *(float *)(&local_d0 + uVar23 * 5) = fVar34;
            }
            fVar34 = (pIVar12->ClipRect).w;
            pfVar28 = (float *)((long)&local_d0 + uVar23 * 0x28 + 4);
            if (*pfVar28 <= fVar34 && fVar34 != *pfVar28) {
              *(float *)((long)&local_d0 + uVar23 * 0x28 + 4) = fVar34;
            }
            uVar29 = uVar29 | 1 << (uVar33 | uVar26);
          }
LAB_00154b48:
          bVar32 = iVar27 == 0;
          iVar27 = iVar27 + -1;
        } while (('\0' < cVar7) && (bVar32));
        pIVar11[uVar25].DrawChannelCurrent = 0xff;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != (long)iVar19);
    if (uVar29 != 0) {
      iVar27 = pIVar10->_Count + -2;
      iVar19 = (pIVar18->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar19 < iVar27) {
        if (iVar19 == 0) {
          iVar31 = 8;
        }
        else {
          iVar31 = iVar19 / 2 + iVar19;
        }
        if (iVar31 <= iVar27) {
          iVar31 = iVar27;
        }
        if (iVar19 < iVar31) {
          pIVar20 = (ImDrawChannel *)MemAlloc((long)iVar31 << 5);
          pIVar30 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
          if (pIVar30 != (ImDrawChannel *)0x0) {
            memcpy(pIVar20,pIVar30,(long)(pIVar18->DrawChannelsTempMergeBuffer).Size << 5);
            MemFree((pIVar18->DrawChannelsTempMergeBuffer).Data);
          }
          (pIVar18->DrawChannelsTempMergeBuffer).Data = pIVar20;
          (pIVar18->DrawChannelsTempMergeBuffer).Capacity = iVar31;
        }
      }
      (pIVar18->DrawChannelsTempMergeBuffer).Size = iVar27;
      pIVar30 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
      local_f8.Storage[0] = 0;
      local_f8.Storage[1] = 0;
      local_f8.Storage[2] = 0;
      local_f8.Storage[3] = 0;
      local_f8.Storage[4] = 0;
      ImBitArray<132,_0>::SetBitRange(&local_f8,2,pIVar10->_Count);
      bVar9 = table->Bg2DrawChannelUnfrozen & 0x1f;
      local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
           local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
           (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
      iVar19 = (pIVar10->_Count - (uint)('\0' < cVar7)) + -2;
      fVar34 = (table->HostClipRect).Min.x;
      fVar4 = (table->HostClipRect).Min.y;
      fVar5 = (table->HostClipRect).Max.x;
      fVar6 = (table->HostClipRect).Max.y;
      lVar22 = (long)local_c4;
      uVar24 = 0;
      do {
        iVar27 = local_c4[uVar24 * 10 + -1];
        if (iVar27 != 0) {
          fVar36 = local_d8[uVar24 * 10];
          fVar35 = fVar36;
          if (fVar34 <= fVar36) {
            fVar35 = fVar34;
          }
          fVar37 = fVar35;
          if ('\0' < cVar8) {
            fVar37 = fVar36;
          }
          fVar36 = local_d8[uVar24 * 10 + 1];
          fVar38 = fVar36;
          if (fVar4 <= fVar36) {
            fVar38 = fVar4;
          }
          if (cVar7 < '\x01') {
            fVar36 = fVar38;
          }
          bVar32 = (uVar24 & 1) != 0;
          if (bVar32) {
            fVar35 = fVar37;
          }
          fVar37 = *(float *)(&local_d0 + uVar24 * 5);
          if (bVar32) {
            uVar29 = -(uint)(fVar5 <= fVar37);
            fVar37 = (float)(~uVar29 & (uint)fVar5 | uVar29 & (uint)fVar37);
          }
          if (uVar24 < 2) {
            fVar36 = fVar38;
          }
          fVar38 = *(float *)((long)&local_d0 + uVar24 * 0x28 + 4);
          if ((uVar24 >= 2) && ((table->Flags & 0x20000) == 0)) {
            uVar29 = -(uint)(fVar6 <= fVar38);
            fVar38 = (float)((uint)fVar38 & uVar29 | ~uVar29 & (uint)fVar6);
          }
          lVar21 = 0;
          do {
            local_f8.Storage[lVar21] = local_f8.Storage[lVar21] & ~*(uint *)(lVar22 + lVar21 * 4);
            lVar21 = lVar21 + 1;
          } while (lVar21 != 5);
          iVar19 = iVar19 - iVar27;
          if (0 < pIVar10->_Count) {
            lVar21 = 8;
            uVar25 = 0;
            do {
              uVar23 = uVar25 >> 5 & 0x7ffffff;
              if ((local_c4[uVar24 * 10 + uVar23] >> ((uint)uVar25 & 0x1f) & 1) != 0) {
                local_c4[uVar24 * 10 + uVar23] =
                     local_c4[uVar24 * 10 + uVar23] & ~(1 << ((byte)uVar25 & 0x1f));
                iVar27 = iVar27 + -1;
                pIVar20 = (pIVar10->_Channels).Data;
                pfVar28 = *(float **)((long)&(pIVar20->_CmdBuffer).Size + lVar21);
                *pfVar28 = fVar35;
                pfVar28[1] = fVar36;
                pfVar28[2] = fVar37;
                pfVar28[3] = fVar38;
                puVar2 = (undefined8 *)((long)pIVar20 + lVar21 + -8);
                uVar14 = *puVar2;
                pIVar12 = (ImDrawCmd *)puVar2[1];
                puVar2 = (undefined8 *)((long)&(pIVar20->_CmdBuffer).Data + lVar21);
                uVar15 = *puVar2;
                puVar16 = (unsigned_short *)puVar2[1];
                (pIVar30->_IdxBuffer).Size = (int)uVar15;
                (pIVar30->_IdxBuffer).Capacity = (int)((ulong)uVar15 >> 0x20);
                (pIVar30->_IdxBuffer).Data = puVar16;
                (pIVar30->_CmdBuffer).Size = (int)uVar14;
                (pIVar30->_CmdBuffer).Capacity = (int)((ulong)uVar14 >> 0x20);
                (pIVar30->_CmdBuffer).Data = pIVar12;
                pIVar30 = pIVar30 + 1;
              }
              uVar25 = uVar25 + 1;
            } while (((long)uVar25 < (long)pIVar10->_Count) && (lVar21 = lVar21 + 0x20, iVar27 != 0)
                    );
          }
        }
        if (uVar24 == 1 && '\0' < cVar7) {
          pIVar13 = (pIVar10->_Channels).Data;
          pIVar20 = pIVar13 + table->Bg2DrawChannelUnfrozen;
          iVar31 = (pIVar20->_CmdBuffer).Size;
          iVar17 = (pIVar20->_CmdBuffer).Capacity;
          pIVar12 = (pIVar20->_CmdBuffer).Data;
          pIVar3 = &pIVar13[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
          iVar27 = pIVar3->Capacity;
          puVar16 = pIVar3->Data;
          (pIVar30->_IdxBuffer).Size = pIVar3->Size;
          (pIVar30->_IdxBuffer).Capacity = iVar27;
          (pIVar30->_IdxBuffer).Data = puVar16;
          (pIVar30->_CmdBuffer).Size = iVar31;
          (pIVar30->_CmdBuffer).Capacity = iVar17;
          (pIVar30->_CmdBuffer).Data = pIVar12;
          pIVar30 = pIVar30 + 1;
        }
        uVar24 = uVar24 + 1;
        lVar22 = lVar22 + 0x28;
      } while (uVar24 != 4);
      iVar27 = pIVar10->_Count;
      if ((0 < iVar27) && (iVar19 != 0)) {
        lVar22 = 0;
        uVar24 = 0;
        do {
          if ((local_f8.Storage[uVar24 >> 5 & 0x7ffffff] >> ((uint)uVar24 & 0x1f) & 1) != 0) {
            pIVar20 = (pIVar10->_Channels).Data;
            puVar2 = (undefined8 *)((long)&(pIVar20->_CmdBuffer).Size + lVar22);
            uVar14 = *puVar2;
            pIVar12 = (ImDrawCmd *)puVar2[1];
            pIVar30->_IdxBuffer =
                 *(ImVector<unsigned_short> *)((long)&(pIVar20->_IdxBuffer).Size + lVar22);
            (pIVar30->_CmdBuffer).Size = (int)uVar14;
            (pIVar30->_CmdBuffer).Capacity = (int)((ulong)uVar14 >> 0x20);
            (pIVar30->_CmdBuffer).Data = pIVar12;
            pIVar30 = pIVar30 + 1;
            iVar19 = iVar19 + -1;
          }
          uVar24 = uVar24 + 1;
          iVar27 = pIVar10->_Count;
        } while (((long)uVar24 < (long)iVar27) && (lVar22 = lVar22 + 0x20, iVar19 != 0));
      }
      memcpy((pIVar10->_Channels).Data + 2,(pIVar18->DrawChannelsTempMergeBuffer).Data,
             (long)iVar27 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0 && src_channel->_CmdBuffer.back().UserCallback != NULL) // Equivalent of PopUnusedDrawCmd()
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}